

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase284::run(TestCase284 *this)

{
  undefined8 node;
  Iface *pIVar1;
  DebugComparison<int,_int_&> _kjCondition;
  pthread_t mainThread;
  WaitScope waitScope;
  Thread thread;
  EventLoop loop;
  siginfo_t info;
  UnixEventPort port;
  char *params_2;
  Promise<siginfo_t> *params_3;
  Promise<siginfo_t> *this_00;
  anon_enum_32 local_29c;
  undefined1 local_298 [40];
  Function<void_()> local_270;
  Maybe<kj::TimerImpl::SleepHooks_&> local_260;
  EventLoop *local_258;
  undefined4 local_250;
  unsigned_long local_248;
  unsigned_long uStack_240;
  char *local_238;
  char *pcStack_230;
  unsigned_long local_228;
  Thread local_220;
  EventLoop local_208;
  Promise<siginfo_t> local_190;
  DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
  local_188 [3];
  UnixEventPort local_110;
  
  if ((anonymous_namespace)::BROKEN_QEMU == '\0') {
    captureSignals();
    UnixEventPort::UnixEventPort(&local_110);
    EventLoop::EventLoop(&local_208,&local_110.super_EventPort);
    local_250 = 0xffffffff;
    local_248 = 0;
    uStack_240 = 0;
    local_258 = &local_208;
    EventLoop::enterScope(&local_208);
    local_260.ptr = (SleepHooks *)pthread_self();
    local_270.impl.ptr = (Iface *)operator_new(0x10);
    *(undefined ***)&(((Impl *)local_270.impl.ptr)->timers)._M_t._M_impl = &PTR_operator___00609778;
    *(Maybe<kj::TimerImpl::SleepHooks_&> **)
     &(((Impl *)local_270.impl.ptr)->timers)._M_t._M_impl.super__Rb_tree_header._M_header =
         &local_260;
    local_270.impl.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase284::run()::$_0>>
          ::instance;
    Thread::Thread(&local_220,&local_270);
    pIVar1 = local_270.impl.ptr;
    if ((Impl *)local_270.impl.ptr != (Impl *)0x0) {
      local_270.impl.ptr = (Iface *)0x0;
      (**(local_270.impl.disposer)->_vptr_Disposer)
                (local_270.impl.disposer,
                 (*(_func_int ***)&(((Timers *)&pIVar1->_vptr_Iface)->_M_t)._M_impl)[-2] +
                 (long)&pIVar1->_vptr_Iface);
    }
    UnixEventPort::onSignal((UnixEventPort *)local_298,(int)&local_110);
    local_238 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
    ;
    pcStack_230 = "run";
    local_228 = 0x1400000131;
    params_2 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
    ;
    params_3 = (Promise<siginfo_t> *)0x48e413;
    this_00 = &local_190;
    Promise<siginfo_t>::wait(this_00,local_298);
    node = local_298._0_8_;
    if ((PromiseArenaMember *)local_298._0_8_ != (PromiseArenaMember *)0x0) {
      local_298._0_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
    local_298[0x20] = (int)local_190.super_PromiseBase.node.ptr == 0x17;
    local_298._0_4_ = 0x17;
    local_298._16_8_ = " == ";
    local_298._24_8_ = &DAT_00000005;
    if (kj::_::Debug::minSeverity < 3 && !local_298[0x20]) {
      params_2 = (char *)&local_29c;
      local_29c = _SC_AIO_LISTIO_MAX;
      local_298._8_8_ = this_00;
      kj::_::Debug::log<char_const(&)[41],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x132,ERROR,
                 "\"failed: expected \" \"(23) == (info.si_signo)\", _kjCondition, 23, info.si_signo"
                 ,(char (*) [41])"failed: expected (23) == (info.si_signo)",
                 (DebugComparison<int,_int_&> *)local_298,(int *)params_2,(int *)this_00);
      params_3 = this_00;
    }
    local_298._8_8_ = local_188;
    local_298[0x20] = local_188[0].left == SI_TKILL;
    local_298._0_4_ = 0xfffffffa;
    local_298._16_8_ = " == ";
    local_298._24_8_ = &DAT_00000005;
    if ((!local_298[0x20]) && (kj::_::Debug::minSeverity < 3)) {
      local_29c = SI_TKILL;
      kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<__11,int&>&,__11,int&>
                ((char *)0x134,0x49ce7d,0x49ced6,local_298,(char (*) [46])&local_29c,
                 (DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
                  *)local_298._8_8_,(anon_enum_32 *)params_2,(int *)params_3);
    }
    Thread::~Thread(&local_220);
    if (local_248 == 0) {
      EventLoop::leaveScope(local_258);
    }
    EventLoop::~EventLoop(&local_208);
    UnixEventPort::~UnixEventPort(&local_110);
  }
  return;
}

Assistant:

TEST(AsyncUnixTest, SignalsAsync) {
  if (BROKEN_QEMU) return;

  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  // Arrange for a signal to be sent from another thread.
  pthread_t mainThread KJ_UNUSED = pthread_self();
  Thread thread([&]() {
    delay();
#if __APPLE__ && KJ_USE_KQUEUE
    // MacOS kqueue only receives process-level signals and there's nothing much we can do about
    // that.
    kill(getpid(), SIGURG);
#else
    pthread_kill(mainThread, SIGURG);
#endif
  });

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
#if __linux__
  EXPECT_SI_CODE(SI_TKILL, info.si_code);
#endif
}